

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

void HorizontalPred(uint8_t *dst,uint8_t *left,int size)

{
  ulong uVar1;
  ulong uVar2;
  
  if (left != (uint8_t *)0x0) {
    uVar2 = 0;
    uVar1 = (ulong)(uint)size;
    if (size < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      memset(dst,(uint)left[uVar2],(ulong)(uint)size);
      dst = dst + 0x20;
    }
    return;
  }
  Fill(dst,0x81,size);
  return;
}

Assistant:

static WEBP_INLINE void HorizontalPred(uint8_t* WEBP_RESTRICT dst,
                                       const uint8_t* WEBP_RESTRICT left,
                                       int size) {
  if (left != NULL) {
    int j;
    for (j = 0; j < size; ++j) {
      memset(dst + j * BPS, left[j], size);
    }
  } else {
    Fill(dst, 129, size);
  }
}